

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

void * __thiscall
kj::anon_unknown_9::DiskHandle::mmap
          (DiskHandle *this,void *__addr,size_t __len,int __prot,int __flags,int __fd,
          __off_t __offset)

{
  void *pvVar1;
  int *piVar2;
  undefined4 in_register_0000000c;
  uint64_t size;
  MmapRange MVar3;
  Fault f;
  
  size = CONCAT44(in_register_0000000c,__prot);
  if (size == 0) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 2) = 0;
    *(undefined8 *)(this + 4) = 0;
  }
  else {
    MVar3 = getMmapRange(__len,size);
    pvVar1 = mmap64((void *)0x0,MVar3.size,1,1,*__addr,MVar3.offset);
    if (pvVar1 == (void *)0xffffffffffffffff) {
      piVar2 = __errno_location();
      _::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x16d,*piVar2,"mmap","");
      _::Debug::Fault::fatal(&f);
    }
    *(size_t *)this = (long)pvVar1 + (__len - MVar3.offset);
    *(uint64_t *)(this + 2) = size;
    *(undefined8 **)(this + 4) = &(anonymous_namespace)::mmapDisposer;
  }
  return this;
}

Assistant:

Array<const byte> mmap(uint64_t offset, uint64_t size) const {
    if (size == 0) return nullptr;  // zero-length mmap() returns EINVAL, so avoid it
    auto range = getMmapRange(offset, size);
    const void* mapping = ::mmap(NULL, range.size, PROT_READ, MAP_SHARED, fd, range.offset);
    if (mapping == MAP_FAILED) {
      KJ_FAIL_SYSCALL("mmap", errno);
    }
    return Array<const byte>(reinterpret_cast<const byte*>(mapping) + (offset - range.offset),
                             size, mmapDisposer);
  }